

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

pair<unsigned_long,_unsigned_long>
httplib::detail::get_range_offset_and_length(Request *req,size_t content_length,size_t index)

{
  pointer ppVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  ppVar1 = (req->ranges).
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = ppVar1[index].first;
  uVar5 = ppVar1[index].second;
  if ((uVar2 & uVar5) == 0xffffffffffffffff) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = content_length;
    return (pair<unsigned_long,_unsigned_long>)(auVar3 << 0x40);
  }
  uVar4 = 0;
  if (0 < (long)(content_length - uVar5)) {
    uVar4 = content_length - uVar5;
  }
  if (uVar2 == 0xffffffffffffffff) {
    uVar5 = content_length - 1;
    uVar2 = uVar4;
  }
  if (uVar5 == 0xffffffffffffffff) {
    uVar5 = content_length - 1;
  }
  pVar6.second = (uVar5 - uVar2) + 1;
  pVar6.first = uVar2;
  return pVar6;
}

Assistant:

inline std::pair<size_t, size_t>
get_range_offset_and_length(const Request &req, size_t content_length,
                            size_t index) {
  auto r = req.ranges[index];

  if (r.first == -1 && r.second == -1) {
    return std::make_pair(0, content_length);
  }

  auto slen = static_cast<ssize_t>(content_length);

  if (r.first == -1) {
    r.first = (std::max)(static_cast<ssize_t>(0), slen - r.second);
    r.second = slen - 1;
  }

  if (r.second == -1) { r.second = slen - 1; }
  return std::make_pair(r.first, static_cast<size_t>(r.second - r.first) + 1);
}